

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_pHYs(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  long in_RSI;
  ucvector *in_RDI;
  uint error;
  uchar *chunk;
  uchar *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  uVar1 = lodepng_chunk_init((uchar **)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             ,in_RDI,(uint)((ulong)in_RSI >> 0x20),(char *)in_stack_ffffffffffffffe0
                            );
  if (uVar1 == 0) {
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 8,*(uint *)(in_RSI + 0xa8));
    lodepng_set32bitInt(in_stack_ffffffffffffffe0 + 0xc,*(uint *)(in_RSI + 0xac));
    in_stack_ffffffffffffffe0[0x10] = (uchar)*(undefined4 *)(in_RSI + 0xb0);
    lodepng_chunk_generate_crc(in_stack_ffffffffffffffe0);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_pHYs(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 9, "pHYs"));
  lodepng_set32bitInt(chunk + 8, info->phys_x);
  lodepng_set32bitInt(chunk + 12, info->phys_y);
  chunk[16] = info->phys_unit;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}